

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandUtil.cpp
# Opt level: O0

Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
llbuild::commands::util::readFileContents(StringRef filename)

{
  StringRef S;
  bool bVar1;
  reference Val;
  size_t sVar2;
  size_t in_RDX;
  undefined8 extraout_RDX;
  anon_union_8_2_427f0595_for_Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_2
  this;
  StringRef str;
  error_code eVar3;
  Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> EVar4;
  Twine local_2c0;
  string local_2a8;
  Twine local_288;
  Twine local_270;
  StringRef local_258;
  string local_248;
  Twine local_228;
  Twine local_210;
  Twine local_1f8;
  Twine local_1e0;
  Twine local_1c8;
  Twine local_1b0;
  Error local_198;
  undefined1 local_190 [8];
  error_code ec;
  undefined1 local_168 [8];
  ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
  bufferOrError;
  undefined1 local_130 [8];
  SmallString<256U> path;
  StringRef filename_local;
  
  path.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._248_8_ =
       filename.Length;
  this = (anon_union_8_2_427f0595_for_Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_2
          )filename.Data;
  S.Length = in_RDX;
  S.Data = (char *)path.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                   InlineElts._248_8_;
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_130,S);
  eVar3 = llvm::sys::fs::make_absolute((SmallVectorImpl<char> *)local_130);
  bufferOrError._16_4_ = eVar3._M_value;
  llvm::Twine::Twine((Twine *)&ec._M_cat,(SmallVectorImpl<char> *)local_130);
  sVar2 = 1;
  llvm::MemoryBuffer::getFile
            ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
              *)local_168,(Twine *)&ec._M_cat,-1,true,false);
  bVar1 = llvm::ErrorOr::operator_cast_to_bool((ErrorOr *)local_168);
  if (bVar1) {
    Val = llvm::
          ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
          operator*((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                     *)local_168);
    llvm::Expected<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>::
    Expected<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
              ((Expected<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                *)this,Val,(type *)0x0);
  }
  else {
    eVar3 = llvm::
            ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
            ::getError((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                        *)local_168);
    ec._0_8_ = eVar3._M_cat;
    local_190._0_4_ = eVar3._M_value;
    llvm::Twine::Twine(&local_210,"unable to read input \"");
    local_258 = llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_130);
    str.Length = sVar2;
    str.Data = (char *)local_258.Length;
    escapedString_abi_cxx11_(&local_248,(util *)local_258.Data,str);
    llvm::Twine::Twine(&local_228,&local_248);
    llvm::operator+(&local_1f8,&local_210,&local_228);
    llvm::Twine::Twine(&local_270,"\" (");
    llvm::operator+(&local_1e0,&local_1f8,&local_270);
    std::error_code::message_abi_cxx11_(&local_2a8,(error_code *)local_190);
    llvm::Twine::Twine(&local_288,&local_2a8);
    llvm::operator+(&local_1c8,&local_1e0,&local_288);
    llvm::Twine::Twine(&local_2c0,")");
    llvm::operator+(&local_1b0,&local_1c8,&local_2c0);
    llvm::make_error<llvm::StringError,llvm::Twine,std::error_code&>
              ((llvm *)&local_198,&local_1b0,(error_code *)local_190);
    llvm::Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
    Expected((Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
              *)this,&local_198);
    llvm::Error::~Error(&local_198);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_248);
  }
  llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
  ~ErrorOr((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
            *)local_168);
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_130);
  EVar4._8_8_ = extraout_RDX;
  EVar4.field_0 = this;
  return EVar4;
}

Assistant:

llvm::Expected<std::unique_ptr<llvm::MemoryBuffer>> util::readFileContents(
    StringRef filename) {
  SmallString<256> path(filename);
  llvm::sys::fs::make_absolute(path);

  auto bufferOrError = llvm::MemoryBuffer::getFile(path);
  if (!bufferOrError) {
    auto ec = bufferOrError.getError();
    return llvm::make_error<llvm::StringError>(
        Twine("unable to read input \"") + util::escapedString(path) +
        "\" (" + ec.message() + ")", ec);
  }
  return std::move(*bufferOrError);
}